

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroExplicitMessage_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::TestBody(NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroExplicitMessage_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  MapField<proto2_nofieldpresence_unittest::TestAllMapTypes_MapInt32ExplicitForeignMessageEntry_DoNotUse,_int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_00;
  MapField<proto2_nofieldpresence_unittest::TestAllMapTypes_MapInt32ExplicitForeignMessageEntry_DoNotUse,_int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_01;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>_3
  *this_02;
  bool bVar1;
  uint uVar2;
  Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage> *this_03;
  ExplicitForeignMessage *pEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  char *pcVar4;
  char *in_R9;
  string_view data;
  AssertHelper local_210;
  AssertionResult gtest_ar__2;
  AssertHelper local_1f8;
  AssertionResult gtest_ar_;
  key_arg<int> local_1cc;
  TestAllMapTypes rt_msg;
  TestAllMapTypes msg;
  
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes(&msg);
  this_00 = &msg.field_0._impl_.map_int32_explicit_foreign_message_;
  this_03 = internal::
            TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::
            MutableMap(&this_00->
                        super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>
                      );
  rt_msg.super_Message.super_MessageLite._vptr_MessageLite._0_4_ = 0;
  pEVar3 = Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::operator[]<int>
                     (this_03,(key_arg<int> *)&rt_msg);
  (pEVar3->field_0)._impl_.c_ = 0;
  *(byte *)&pEVar3->field_0 = *(byte *)&pEVar3->field_0 | 1;
  output = &(this->
            super_NoFieldPresenceMapSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).value_;
  bVar1 = MessageLite::SerializeToString((MessageLite *)&msg,output);
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string((string *)&rt_msg,(string *)output);
    gtest_ar_.success_ = rt_msg.super_Message.super_MessageLite._internal_metadata_.ptr_ != 0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    std::__cxx11::string::~string((string *)&rt_msg);
    if (gtest_ar_.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes(&rt_msg);
      std::__cxx11::string::string((string *)&gtest_ar_,(string *)output);
      data._M_str._4_4_ = gtest_ar_._4_4_;
      data._M_str._0_1_ = gtest_ar_.success_;
      data._M_str._1_3_ = gtest_ar_._1_3_;
      data._M_len = (size_t)gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      bVar1 = MessageLite::ParseFromString((MessageLite *)&rt_msg,data);
      gtest_ar__2.success_ = bVar1;
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if (gtest_ar__2.success_ == false) {
        testing::Message::Message((Message *)&local_210);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                   (AssertionResult *)"rt_msg.ParseFromString(this->GetOutput())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,0x3e1,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
        testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_1f8);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if ((long *)CONCAT44(local_210.data_._4_4_,(int32_t)local_210.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_210.data_._4_4_,(int32_t)local_210.data_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      this_01 = &rt_msg.field_0._impl_.map_int32_explicit_foreign_message_;
      internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_01);
      this_02 = &rt_msg.field_0._impl_.map_int32_explicit_foreign_message_.
                 super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>
                 .field_0;
      local_210.data_._0_4_ = 0;
      pEVar3 = Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::at<int>
                         (&this_02->map_,(key_arg<int> *)&local_210);
      gtest_ar__2._0_4_ = (pEVar3->field_0)._impl_.c_;
      internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_00);
      local_1cc = 0;
      pEVar3 = Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::at<int>
                         (&msg.field_0._impl_.map_int32_explicit_foreign_message_.
                           super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>
                           .field_0.map_,&local_1cc);
      local_1f8.data_._0_4_ = (pEVar3->field_0)._impl_.c_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_,"rt_msg.map_int32_explicit_foreign_message().at(0).c()",
                 "msg.map_int32_explicit_foreign_message().at(0).c()",(int *)&gtest_ar__2,
                 (int *)&local_1f8);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__2);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = anon_var_dwarf_651463 + 5;
        }
        else {
          pcVar4 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_210,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,0x3e4,pcVar4);
        testing::internal::AssertHelper::operator=(&local_210,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper(&local_210);
        if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      gtest_ar__2.success_ = false;
      gtest_ar__2._1_3_ = 0;
      internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_01);
      local_1f8.data_._0_4_ = 0;
      pEVar3 = Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::at<int>
                         (&this_02->map_,(key_arg<int> *)&local_1f8);
      local_210.data_._0_4_ = (pEVar3->field_0)._impl_.c_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_,"0","rt_msg.map_int32_explicit_foreign_message().at(0).c()",
                 (int *)&gtest_ar__2,(int *)&local_210);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__2);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = anon_var_dwarf_651463 + 5;
        }
        else {
          pcVar4 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_210,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,1000,pcVar4);
        testing::internal::AssertHelper::operator=(&local_210,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper(&local_210);
        if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_01);
      gtest_ar_.success_ = false;
      gtest_ar_._1_3_ = 0;
      pEVar3 = Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::at<int>
                         (&this_02->map_,(key_arg<int> *)&gtest_ar_);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      uVar2 = (pEVar3->field_0)._impl_._has_bits_.has_bits_[0] & 1;
      gtest_ar__2.success_ = SUB41(uVar2,0);
      if (uVar2 == 0) {
        testing::Message::Message((Message *)&local_210);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                   (AssertionResult *)"rt_msg.map_int32_explicit_foreign_message().at(0).has_c()",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,0x3ed,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
        testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_1f8);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if ((long *)CONCAT44(local_210.data_._4_4_,(int32_t)local_210.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_210.data_._4_4_,(int32_t)local_210.data_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes(&rt_msg);
      goto LAB_006e8e49;
    }
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&rt_msg,(internal *)&gtest_ar_,
               (AssertionResult *)"this->GetOutput().empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x3dd,(char *)CONCAT44(rt_msg.super_Message.super_MessageLite._vptr_MessageLite.
                                       _4_4_,rt_msg.super_Message.super_MessageLite.
                                             _vptr_MessageLite._0_4_));
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&gtest_ar__2);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&rt_msg,(internal *)&gtest_ar_,
               (AssertionResult *)"TestSerialize(msg, &output_sink)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x3db,(char *)CONCAT44(rt_msg.super_Message.super_MessageLite._vptr_MessageLite.
                                       _4_4_,rt_msg.super_Message.super_MessageLite.
                                             _vptr_MessageLite._0_4_));
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&gtest_ar__2);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_210);
  std::__cxx11::string::~string((string *)&rt_msg);
  if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_006e8e49:
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes(&msg);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest,
           MapRoundTripZeroKeyZeroExplicitMessage) {
  TestAllMapTypes msg;
  (*msg.mutable_map_int32_explicit_foreign_message())[0].set_c(0);

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  // TODO: b/368089585 - write this better when we have access to EqualsProto.
  EXPECT_EQ(rt_msg.map_int32_explicit_foreign_message().at(0).c(),
            msg.map_int32_explicit_foreign_message().at(0).c());

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ(0, rt_msg.map_int32_explicit_foreign_message().at(0).c());

  // However, explicit presence messages expose a `has_foo` API.
  // Because fields in an explicit message is explicitly set, they are expected
  // to be present.
  EXPECT_TRUE(rt_msg.map_int32_explicit_foreign_message().at(0).has_c());
}